

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O2

bool __thiscall dynamicgraph::TimeDependency<int>::needUpdate(TimeDependency<int> *this,int *t1)

{
  int iVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  int *piVar5;
  undefined4 extraout_var_00;
  uint uVar6;
  _List_node_base *p_Var7;
  
  uVar6 = 1;
  if (((this->leader->ready == false) && (this->lastAskForUpdate == 0)) &&
     (this->dependencyType != ALWAYS_READY)) {
    if (this->dependencyType == TIME_DEPENDENT) {
      iVar1 = *t1;
      iVar4 = (*this->leader->_vptr_SignalBase[2])();
      if (iVar1 < this->periodTime + *(int *)CONCAT44(extraout_var,iVar4)) {
        uVar6 = 0;
        goto LAB_001200b0;
      }
    }
    uVar6 = (uint)this->updateFromAllChildren;
    p_Var7 = (_List_node_base *)&this->dependencies;
    do {
      while( true ) {
        p_Var7 = (((_List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
                    *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var7 == (_List_node_base *)&this->dependencies) goto LAB_001200a9;
        plVar2 = (long *)p_Var7[1]._M_next;
        piVar5 = (int *)(**(code **)(*plVar2 + 0x10))(plVar2);
        iVar1 = *piVar5;
        iVar4 = (*this->leader->_vptr_SignalBase[2])();
        if (iVar1 <= *(int *)CONCAT44(extraout_var_00,iVar4)) break;
LAB_00120094:
        if (this->updateFromAllChildren == false) {
          uVar6 = 1;
          goto LAB_001200a9;
        }
      }
      cVar3 = (**(code **)(*plVar2 + 0x48))(plVar2,t1);
      if (cVar3 != '\0') goto LAB_00120094;
    } while (this->updateFromAllChildren != true);
    uVar6 = 0;
LAB_001200a9:
    this->lastAskForUpdate = uVar6;
  }
LAB_001200b0:
  return SUB41(uVar6,0);
}

Assistant:

bool TimeDependency<Time>::needUpdate(const Time &t1) const {
  dgTDEBUG(15) << "# In {" << leader.getName() << " : (" << leader.getReady()
               << ") " << t1 << " >? " << leader.getTime() << std::endl;

  if (leader.getReady()) {
    dgTDEBUGOUT(15);
    return true;
  }
  if (lastAskForUpdate) {
    dgTDEBUGOUT(15);
    return true;
  }

  switch (dependencyType) {
    case ALWAYS_READY: {
      dgTDEBUGOUT(15);
      return true;
    }
    case BOOL_DEPENDENT:
      break;
    case TIME_DEPENDENT: {
      if (t1 < leader.getTime() + periodTime) {
        dgTDEBUGOUT(15);
        return false;
      }
      break;
    }
  };

  bool res = updateFromAllChildren;
  const typename Dependencies::const_iterator itend = dependencies.end();
  for (typename Dependencies::const_iterator it = dependencies.begin();
       it != itend; ++it) {
    const SignalBase<Time> &sig = **it;
    dgTDEBUG(15) << "Ask update for " << sig << std::endl;

    if ((sig.getTime() > leader.getTime()) || (sig.needUpdate(t1))) {
      if (updateFromAllChildren)
        continue;
      else {
        res = true;
        break;
      }
    } else {
      if (updateFromAllChildren) {
        res = false;
        break;
      } else
        continue;
    }
  }
  lastAskForUpdate = res;

  dgTDEBUGOUT(15);
  return res;
}